

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O2

int32_t __thiscall
icu_63::MessagePattern::parseArg
          (MessagePattern *this,int32_t index,int32_t argStartLength,int32_t nestingLevel,
          UParseError *parseError,UErrorCode *errorCode)

{
  UnicodeString *s;
  short sVar1;
  int start;
  bool bVar2;
  UBool UVar3;
  byte bVar4;
  char16_t cVar5;
  int32_t index_00;
  int32_t iVar6;
  uint value;
  int iVar7;
  int32_t iVar8;
  int offset;
  UMessagePatternPartType type;
  UMessagePatternArgType argType;
  int iVar9;
  bool bVar10;
  
  start = this->partsLength;
  addPart(this,UMSGPAT_PART_TYPE_ARG_START,index,argStartLength,0,errorCode);
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  index_00 = skipWhiteSpace(this,argStartLength + index);
  sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar9 = (this->msg).fUnion.fFields.fLength;
  }
  else {
    iVar9 = (int)sVar1 >> 5;
  }
  if (index_00 == iVar9) {
LAB_002830d6:
    setParseError(this,parseError,0);
    *errorCode = U_UNMATCHED_BRACES;
    return 0;
  }
  s = &this->msg;
  iVar6 = skipIdentifier(this,index_00);
  value = parseArgNumber(s,index_00,iVar6);
  if ((int)value < 0) {
    if (value != 0xffffffff) goto LAB_0028317a;
    iVar8 = iVar6 - index_00;
    if (0xffff < iVar8) goto LAB_002832d6;
    this->hasArgNames = '\x01';
    type = UMSGPAT_PART_TYPE_ARG_NAME;
    value = 0;
  }
  else {
    iVar8 = iVar6 - index_00;
    if (0x7fff < value || 0xffff < iVar8) goto LAB_002832d6;
    this->hasArgNumbers = '\x01';
    type = UMSGPAT_PART_TYPE_ARG_NUMBER;
  }
  addPart(this,type,index_00,iVar8,value,errorCode);
  iVar6 = skipWhiteSpace(this,iVar6);
  sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar9 = (this->msg).fUnion.fFields.fLength;
  }
  else {
    iVar9 = (int)sVar1 >> 5;
  }
  if (iVar6 == iVar9) goto LAB_002830d6;
  cVar5 = UnicodeString::doCharAt(s,iVar6);
  if (cVar5 != L',') {
    argType = UMSGPAT_ARG_TYPE_NONE;
    if (cVar5 == L'}') goto LAB_002831d4;
    goto LAB_00283407;
  }
  iVar8 = skipWhiteSpace(this,iVar6 + 1);
  iVar9 = 0;
  while( true ) {
    sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar7 = (this->msg).fUnion.fFields.fLength;
    }
    else {
      iVar7 = (int)sVar1 >> 5;
    }
    offset = iVar8 + iVar9;
    if ((iVar7 <= offset) ||
       (cVar5 = UnicodeString::doCharAt(s,offset), ((ushort)cVar5 & 0xffdf) - 0x5b < 0xffffffe6))
    break;
    iVar9 = iVar9 + 1;
  }
  iVar6 = skipWhiteSpace(this,offset);
  sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar7 = (this->msg).fUnion.fFields.fLength;
  }
  else {
    iVar7 = (int)sVar1 >> 5;
  }
  if (iVar6 == iVar7) goto LAB_002830d6;
  if ((iVar9 == 0) || ((cVar5 = UnicodeString::doCharAt(s,iVar6), cVar5 != L',' && (cVar5 != L'}')))
     ) {
LAB_0028317a:
    setParseError(this,parseError,index_00);
    *errorCode = U_PATTERN_SYNTAX_ERROR;
    return 0;
  }
  if (0xffff < iVar9) {
LAB_002832d6:
    setParseError(this,parseError,index_00);
    *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
    return 0;
  }
  bVar10 = true;
  if (iVar9 == 0xd) {
    UVar3 = isSelect(this,iVar8);
    if (UVar3 == '\0') {
      bVar2 = false;
      argType = UMSGPAT_ARG_TYPE_SIMPLE;
      bVar10 = true;
    }
    else {
      bVar4 = isOrdinal(this,iVar8 + 6);
      bVar10 = bVar4 == 0;
      argType = (uint)bVar4 * 4 + UMSGPAT_ARG_TYPE_SIMPLE;
LAB_002833a1:
      bVar2 = false;
    }
  }
  else if (iVar9 == 6) {
    UVar3 = isChoice(this,iVar8);
    if (UVar3 == '\0') {
      UVar3 = isPlural(this,iVar8);
      if (UVar3 == '\0') {
        bVar4 = isSelect(this,iVar8);
        bVar10 = bVar4 == 0;
        argType = (uint)bVar4 + (uint)bVar4 * 2 + UMSGPAT_ARG_TYPE_SIMPLE;
      }
      else {
        argType = UMSGPAT_ARG_TYPE_PLURAL;
        bVar10 = false;
      }
      goto LAB_002833a1;
    }
    argType = UMSGPAT_ARG_TYPE_CHOICE;
    bVar2 = true;
    bVar10 = false;
  }
  else {
    bVar2 = false;
    argType = UMSGPAT_ARG_TYPE_SIMPLE;
  }
  (this->partsList->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.ptr[start].value =
       (int16_t)argType;
  if (bVar10) {
    addPart(this,UMSGPAT_PART_TYPE_ARG_TYPE,iVar8,iVar9,0,errorCode);
    if (cVar5 != L'}') {
      iVar6 = parseSimpleStyle(this,iVar6 + 1,parseError,errorCode);
    }
  }
  else {
    if (cVar5 == L'}') {
LAB_00283407:
      setParseError(this,parseError,index_00);
      *errorCode = U_PATTERN_SYNTAX_ERROR;
      return 0;
    }
    if (bVar2) {
      iVar6 = parseChoiceStyle(this,iVar6 + 1,nestingLevel,parseError,errorCode);
    }
    else {
      iVar6 = parsePluralOrSelectStyle(this,argType,iVar6 + 1,nestingLevel,parseError,errorCode);
    }
  }
LAB_002831d4:
  addLimitPart(this,start,UMSGPAT_PART_TYPE_ARG_LIMIT,iVar6,1,argType,errorCode);
  return iVar6 + 1;
}

Assistant:

int32_t
MessagePattern::parseArg(int32_t index, int32_t argStartLength, int32_t nestingLevel,
                         UParseError *parseError, UErrorCode &errorCode) {
    int32_t argStart=partsLength;
    UMessagePatternArgType argType=UMSGPAT_ARG_TYPE_NONE;
    addPart(UMSGPAT_PART_TYPE_ARG_START, index, argStartLength, argType, errorCode);
    if(U_FAILURE(errorCode)) {
        return 0;
    }
    int32_t nameIndex=index=skipWhiteSpace(index+argStartLength);
    if(index==msg.length()) {
        setParseError(parseError, 0);  // Unmatched '{' braces in message.
        errorCode=U_UNMATCHED_BRACES;
        return 0;
    }
    // parse argument name or number
    index=skipIdentifier(index);
    int32_t number=parseArgNumber(nameIndex, index);
    if(number>=0) {
        int32_t length=index-nameIndex;
        if(length>Part::MAX_LENGTH || number>Part::MAX_VALUE) {
            setParseError(parseError, nameIndex);  // Argument number too large.
            errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }
        hasArgNumbers=TRUE;
        addPart(UMSGPAT_PART_TYPE_ARG_NUMBER, nameIndex, length, number, errorCode);
    } else if(number==UMSGPAT_ARG_NAME_NOT_NUMBER) {
        int32_t length=index-nameIndex;
        if(length>Part::MAX_LENGTH) {
            setParseError(parseError, nameIndex);  // Argument name too long.
            errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }
        hasArgNames=TRUE;
        addPart(UMSGPAT_PART_TYPE_ARG_NAME, nameIndex, length, 0, errorCode);
    } else {  // number<-1 (ARG_NAME_NOT_VALID)
        setParseError(parseError, nameIndex);  // Bad argument syntax.
        errorCode=U_PATTERN_SYNTAX_ERROR;
        return 0;
    }
    index=skipWhiteSpace(index);
    if(index==msg.length()) {
        setParseError(parseError, 0);  // Unmatched '{' braces in message.
        errorCode=U_UNMATCHED_BRACES;
        return 0;
    }
    UChar c=msg.charAt(index);
    if(c==u_rightCurlyBrace) {
        // all done
    } else if(c!=u_comma) {
        setParseError(parseError, nameIndex);  // Bad argument syntax.
        errorCode=U_PATTERN_SYNTAX_ERROR;
        return 0;
    } else /* ',' */ {
        // parse argument type: case-sensitive a-zA-Z
        int32_t typeIndex=index=skipWhiteSpace(index+1);
        while(index<msg.length() && isArgTypeChar(msg.charAt(index))) {
            ++index;
        }
        int32_t length=index-typeIndex;
        index=skipWhiteSpace(index);
        if(index==msg.length()) {
            setParseError(parseError, 0);  // Unmatched '{' braces in message.
            errorCode=U_UNMATCHED_BRACES;
            return 0;
        }
        if(length==0 || ((c=msg.charAt(index))!=u_comma && c!=u_rightCurlyBrace)) {
            setParseError(parseError, nameIndex);  // Bad argument syntax.
            errorCode=U_PATTERN_SYNTAX_ERROR;
            return 0;
        }
        if(length>Part::MAX_LENGTH) {
            setParseError(parseError, nameIndex);  // Argument type name too long.
            errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }
        argType=UMSGPAT_ARG_TYPE_SIMPLE;
        if(length==6) {
            // case-insensitive comparisons for complex-type names
            if(isChoice(typeIndex)) {
                argType=UMSGPAT_ARG_TYPE_CHOICE;
            } else if(isPlural(typeIndex)) {
                argType=UMSGPAT_ARG_TYPE_PLURAL;
            } else if(isSelect(typeIndex)) {
                argType=UMSGPAT_ARG_TYPE_SELECT;
            }
        } else if(length==13) {
            if(isSelect(typeIndex) && isOrdinal(typeIndex+6)) {
                argType=UMSGPAT_ARG_TYPE_SELECTORDINAL;
            }
        }
        // change the ARG_START type from NONE to argType
        partsList->a[argStart].value=(int16_t)argType;
        if(argType==UMSGPAT_ARG_TYPE_SIMPLE) {
            addPart(UMSGPAT_PART_TYPE_ARG_TYPE, typeIndex, length, 0, errorCode);
        }
        // look for an argument style (pattern)
        if(c==u_rightCurlyBrace) {
            if(argType!=UMSGPAT_ARG_TYPE_SIMPLE) {
                setParseError(parseError, nameIndex);  // No style field for complex argument.
                errorCode=U_PATTERN_SYNTAX_ERROR;
                return 0;
            }
        } else /* ',' */ {
            ++index;
            if(argType==UMSGPAT_ARG_TYPE_SIMPLE) {
                index=parseSimpleStyle(index, parseError, errorCode);
            } else if(argType==UMSGPAT_ARG_TYPE_CHOICE) {
                index=parseChoiceStyle(index, nestingLevel, parseError, errorCode);
            } else {
                index=parsePluralOrSelectStyle(argType, index, nestingLevel, parseError, errorCode);
            }
        }
    }
    // Argument parsing stopped on the '}'.
    addLimitPart(argStart, UMSGPAT_PART_TYPE_ARG_LIMIT, index, 1, argType, errorCode);
    return index+1;
}